

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals2
          (SPxSolverBase<double> *this,double leaveMax,SPxId enterId,double *enterBound,
          double *newUBbound,double *newLBbound,double *newCoPrhs,StableSum<double> *objChange)

{
  bool bVar1;
  Status SVar2;
  undefined8 uVar3;
  Status *pSVar4;
  double *pdVar5;
  ostream *poVar6;
  void *pvVar7;
  string *m;
  double *in_RCX;
  double *in_RDX;
  SPxSolverBase<double> *in_RDI;
  double *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double dVar8;
  StableSum<double> *in_stack_00000008;
  Status enterStat_1;
  int idx_1;
  Status enterStat;
  int idx;
  Desc *ds;
  string *in_stack_fffffffffffffda8;
  int iVar9;
  SPxLPBase<double> *in_stack_fffffffffffffdb0;
  allocator *paVar10;
  undefined8 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [36];
  Status local_e4;
  SPxColId local_e0;
  int local_d8;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [38];
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [35];
  undefined1 local_85;
  allocator local_71;
  string local_70 [32];
  Status local_50;
  SPxRowId local_4c;
  int local_44;
  Desc *local_40;
  double *local_38;
  double *local_30;
  double *local_28;
  double *local_20;
  double local_18;
  SPxId local_8;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_XMM0_Qa;
  local_40 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  *local_20 = 0.0;
  bVar1 = SPxId::isSPxRowId(&local_8);
  if (bVar1) {
    SPxRowId::SPxRowId(&local_4c,&local_8);
    local_44 = SPxLPBase<double>::number
                         (in_stack_fffffffffffffdb0,(SPxRowId *)in_stack_fffffffffffffda8);
    pSVar4 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_fffffffffffffdb0,
                        (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    local_50 = *pSVar4;
    switch(local_50) {
    case D_FREE:
      UpdateVector<double>::delta(in_RDI->thePvec);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      dVar8 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
      if (0.0 <= dVar8 * local_18) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      pdVar5 = (double *)infinity();
      *local_28 = *pdVar5;
      pdVar5 = (double *)infinity();
      *local_30 = -*pdVar5;
      pSVar4 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
      *pSVar4 = P_FIXED;
      break;
    case D_ON_UPPER:
      *local_28 = 0.0;
      pdVar5 = (double *)infinity();
      *local_30 = -*pdVar5;
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      pSVar4 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
      *pSVar4 = P_ON_LOWER;
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9)
      ;
      *local_38 = *pdVar5;
      break;
    case D_ON_LOWER:
      pdVar5 = (double *)infinity();
      *local_28 = *pdVar5;
      *local_30 = 0.0;
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      pSVar4 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
      *pSVar4 = P_ON_UPPER;
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9)
      ;
      *local_38 = *pdVar5;
      break;
    case D_ON_BOTH:
      UpdateVector<double>::delta(in_RDI->thePvec);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      dVar8 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
      if (0.0 <= local_18 * dVar8) {
        pdVar5 = (double *)infinity();
        *local_28 = *pdVar5;
        *local_30 = 0.0;
        pSVar4 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
        *pSVar4 = P_ON_UPPER;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      else {
        *local_28 = 0.0;
        pdVar5 = (double *)infinity();
        *local_30 = -*pdVar5;
        pSVar4 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
        *pSVar4 = P_ON_LOWER;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      break;
    case P_FIXED:
      poVar6 = std::operator<<((ostream *)&std::cerr,"ELEAVE54 ");
      poVar6 = std::operator<<(poVar6,"ERROR! Tried to put a fixed row variable into the basis: ");
      poVar6 = std::operator<<(poVar6,"idx=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_44);
      poVar6 = std::operator<<(poVar6,", lhs=");
      pdVar5 = SPxLPBase<double>::lhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pdVar5);
      poVar6 = std::operator<<(poVar6,", rhs=");
      pdVar5 = SPxLPBase<double>::rhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      pvVar7 = (void *)std::ostream::operator<<(poVar6,*pdVar5);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      local_aa = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"XLEAVE05 This should never happen.",&local_a9);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_aa = 0;
      __cxa_throw(uVar3,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    default:
      local_d2 = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"XLEAVE06 This should never happen.",&local_d1);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_d2 = 0;
      __cxa_throw(uVar3,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case P_ON_LOWER:
      SVar2 = SPxBasisBase<double>::dualRowStatus
                        ((SPxBasisBase<double> *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),iVar9);
      pSVar4 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *pSVar4 = SVar2;
      pdVar5 = SPxLPBase<double>::rhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      dVar8 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (dVar8 < *pdVar5) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        dVar8 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        *pdVar5 = dVar8;
      }
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *local_38 = *pdVar5;
      pdVar5 = SPxLPBase<double>::rhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_30 = -*pdVar5;
      pdVar5 = SPxLPBase<double>::lhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_28 = -*pdVar5;
      pdVar5 = SPxLPBase<double>::lhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_20 = -*pdVar5;
      SPxLPBase<double>::lhs
                (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      break;
    case P_ON_UPPER:
      SVar2 = SPxBasisBase<double>::dualRowStatus
                        ((SPxBasisBase<double> *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),iVar9);
      pSVar4 = SPxBasisBase<double>::Desc::rowStatus
                         ((Desc *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *pSVar4 = SVar2;
      pdVar5 = SPxLPBase<double>::lhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      dVar8 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (-*pdVar5 < dVar8) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        dVar8 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        *pdVar5 = dVar8;
      }
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *local_38 = *pdVar5;
      pdVar5 = SPxLPBase<double>::lhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_28 = -*pdVar5;
      pdVar5 = SPxLPBase<double>::rhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_30 = -*pdVar5;
      pdVar5 = SPxLPBase<double>::rhs
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_20 = -*pdVar5;
      SPxLPBase<double>::rhs
                (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      break;
    case P_FREE:
      local_85 = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"XLEAVE04 This should never happen.",&local_71);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_85 = 0;
      __cxa_throw(uVar3,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    pSVar4 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[77],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [77])
                      "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n"
               ,&local_44,&local_50,pSVar4,in_stack_00000008);
  }
  else {
    SPxColId::SPxColId(&local_e0,&local_8);
    local_d8 = SPxLPBase<double>::number
                         (in_stack_fffffffffffffdb0,(SPxColId *)in_stack_fffffffffffffda8);
    pSVar4 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_fffffffffffffdb0,
                        (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    local_e4 = *pSVar4;
    switch(local_e4) {
    case D_FREE:
      pdVar5 = (double *)infinity();
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      *local_28 = *pdVar5;
      pdVar5 = (double *)infinity();
      *local_30 = -*pdVar5;
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9)
      ;
      *local_38 = *pdVar5;
      pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
      *pSVar4 = P_FIXED;
      break;
    case D_ON_UPPER:
      *local_28 = 0.0;
      pdVar5 = (double *)infinity();
      *local_30 = -*pdVar5;
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
      *pSVar4 = P_ON_LOWER;
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9)
      ;
      *local_38 = *pdVar5;
      break;
    case D_ON_LOWER:
      pdVar5 = (double *)infinity();
      *local_28 = *pdVar5;
      *local_30 = 0.0;
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
      *pSVar4 = P_ON_UPPER;
      pdVar5 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9)
      ;
      *local_38 = *pdVar5;
      break;
    case D_ON_BOTH:
      UpdateVector<double>::delta(in_RDI->theCoPvec);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      dVar8 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
      if (0.0 <= local_18 * dVar8) {
        pdVar5 = (double *)infinity();
        *local_28 = *pdVar5;
        *local_30 = 0.0;
        pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
        *pSVar4 = P_ON_UPPER;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      else {
        *local_28 = 0.0;
        pdVar5 = (double *)infinity();
        *local_30 = -*pdVar5;
        pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
        *pSVar4 = P_ON_LOWER;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      break;
    case P_FIXED:
      poVar6 = std::operator<<((ostream *)&std::cerr,"ELEAVE56 ");
      poVar6 = std::operator<<(poVar6,"ERROR! Tried to put a fixed column variable into the basis. "
                              );
      poVar6 = std::operator<<(poVar6,"idx=");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_d8);
      poVar6 = std::operator<<(poVar6,", lower=");
      pdVar5 = SPxLPBase<double>::lower
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pdVar5);
      poVar6 = std::operator<<(poVar6,", upper=");
      pdVar5 = SPxLPBase<double>::upper
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      pvVar7 = (void *)std::ostream::operator<<(poVar6,*pdVar5);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      local_10a = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      paVar10 = &local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"XLEAVE07 This should never happen.",paVar10);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_10a = 0;
      __cxa_throw(uVar3,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    default:
      m = (string *)__cxa_allocate_exception(0x28);
      paVar10 = &local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"XLEAVE08 This should never happen.",paVar10);
      SPxInternalCodeException::SPxInternalCodeException((SPxInternalCodeException *)paVar10,m);
      __cxa_throw(m,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case P_ON_LOWER:
      SVar2 = SPxBasisBase<double>::dualColStatus
                        ((SPxBasisBase<double> *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),iVar9);
      pSVar4 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *pSVar4 = SVar2;
      pdVar5 = SPxLPBase<double>::upper
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      dVar8 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (dVar8 < *pdVar5) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        dVar8 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        *pdVar5 = dVar8;
      }
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *local_38 = *pdVar5;
      pdVar5 = SPxLPBase<double>::upper
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_28 = *pdVar5;
      pdVar5 = SPxLPBase<double>::lower
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_30 = *pdVar5;
      pdVar5 = SPxLPBase<double>::lower
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_20 = *pdVar5;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      break;
    case P_ON_UPPER:
      SVar2 = SPxBasisBase<double>::dualColStatus
                        ((SPxBasisBase<double> *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),iVar9);
      pSVar4 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *pSVar4 = SVar2;
      pdVar5 = SPxLPBase<double>::lower
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      dVar8 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (-*pdVar5 < dVar8) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        dVar8 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                            (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        *pdVar5 = dVar8;
      }
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffdb0,
                          (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      *local_38 = *pdVar5;
      pdVar5 = SPxLPBase<double>::upper
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_28 = *pdVar5;
      pdVar5 = SPxLPBase<double>::lower
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_30 = *pdVar5;
      pdVar5 = SPxLPBase<double>::upper
                         (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20))
      ;
      *local_20 = *pdVar5;
      StableSum<double>::operator-=
                ((StableSum<double> *)in_stack_fffffffffffffdb0,(double)in_stack_fffffffffffffda8);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      break;
    case P_FREE:
      SVar2 = SPxBasisBase<double>::dualColStatus
                        ((SPxBasisBase<double> *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),iVar9);
      iVar9 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
      *pSVar4 = SVar2;
      UpdateVector<double>::delta(in_RDI->thePvec);
      dVar8 = SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
      if (dVar8 * local_18 <= 0.0) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffdb0,iVar9);
        *local_38 = *pdVar5;
      }
      pdVar5 = SPxLPBase<double>::upper(in_stack_fffffffffffffdb0,iVar9);
      *local_28 = *pdVar5;
      pdVar5 = SPxLPBase<double>::lower(in_stack_fffffffffffffdb0,iVar9);
      *local_30 = *pdVar5;
      *local_20 = 0.0;
    }
    pSVar4 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffdb0,iVar9);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[77],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [77])
                      "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n"
               ,&local_d8,&local_e4,pSVar4,in_stack_00000008);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}